

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimulationResult.cpp
# Opt level: O1

void __thiscall SimulationResult::UpdateStatistics(SimulationResult *this)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  double dVar4;
  undefined1 in_ZMM1 [64];
  
  uVar2 = (ulong)this->_m_nr_stored;
  if (uVar2 == 0) {
    dVar4 = 0.0;
  }
  else {
    dVar4 = 0.0;
    uVar3 = 0;
    do {
      dVar4 = dVar4 + (this->_m_rewards).super__Vector_base<double,_std::allocator<double>_>._M_impl
                      .super__Vector_impl_data._M_start[uVar3];
      uVar3 = uVar3 + 1;
    } while (uVar2 != uVar3);
  }
  auVar1 = vcvtusi2sd_avx512f(in_ZMM1._0_16_,this->_m_nr_stored);
  this->_m_avg_reward =
       (double)((ulong)(uVar2 == 0) * 0x7fefffffffffffff +
               (ulong)(uVar2 != 0) * (long)(dVar4 / auVar1._0_8_));
  return;
}

Assistant:

void SimulationResult::UpdateStatistics()
{ 
    // update the average reward
    double sum=0;
    for(unsigned int i=0;i<_m_nr_stored;i++)
        sum+=_m_rewards[i];

    if(_m_nr_stored>0)
        _m_avg_reward=sum/_m_nr_stored;
    else
        _m_avg_reward=DBL_MAX;
}